

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

bool Js::TPropertyKey_IsInternalPropertyId(JavascriptString *key)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  bVar2 = VarIsImpl<Js::PropertyString>(&key->super_RecyclableObject);
  if ((bVar2) &&
     (*(uint *)(key[1].super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject + 1) < 0x10)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x6b,
                                "(!VarIs<PropertyString>(key) || !IsInternalPropertyId(((PropertyString*)key)->GetPropertyId()))"
                                ,
                                "!VarIs<PropertyString>(key) || !IsInternalPropertyId(((PropertyString*)key)->GetPropertyId())"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return false;
}

Assistant:

bool TPropertyKey_IsInternalPropertyId(JavascriptString* key)
    {
        // WARNING: This will return false for PropertyStrings that are actually InternalPropertyIds
        Assert(!VarIs<PropertyString>(key) || !IsInternalPropertyId(((PropertyString*)key)->GetPropertyId()));

        return false;
    }